

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAiger.c
# Opt level: O3

void Gia_AigerWrite(Gia_Man_t *pInit,char *pFileName,int fWriteSymbols,int fCompact)

{
  Gia_Obj_t *pGVar1;
  bool bVar2;
  byte bVar3;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  Vec_Ptr_t *pVVar11;
  Gia_Man_t *pGVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  FILE *__stream;
  Gia_Man_t *p;
  Vec_Int_t *pVVar16;
  Vec_Str_t *pVVar17;
  void *__ptr;
  float *pfVar18;
  size_t sVar19;
  uint uVar20;
  char *pcVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  byte *pbVar28;
  uint uVar29;
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  undefined4 local_40 [2];
  Gia_Man_t *local_38;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  
  if ((pInit->nXors != 0) || (pInit->nMuxes != 0)) {
    __assert_fail("pInit->nXors == 0 && pInit->nMuxes == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaAiger.c"
                  ,0x441,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int)");
  }
  if (pInit->vCos->nSize == 0) {
    puts("AIG cannot be written because it has no POs.");
    return;
  }
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Gia_AigerWrite(): Cannot open the output file \"%s\".\n",pFileName);
    return;
  }
  iVar13 = Gia_ManIsNormalized(pInit);
  p = pInit;
  if (iVar13 == 0) {
    p = Gia_ManDupNormalize(pInit,0);
    Gia_ManTransferMapping(p,pInit);
    Gia_ManTransferPacking(p,pInit);
    Gia_ManTransferTiming(p,pInit);
    pVVar11 = pInit->vNamesOut;
    p->vNamesIn = pInit->vNamesIn;
    p->vNamesOut = pVVar11;
    pInit->vNamesIn = (Vec_Ptr_t *)0x0;
    pInit->vNamesOut = (Vec_Ptr_t *)0x0;
    p->nConstrs = pInit->nConstrs;
    pInit->nConstrs = 0;
  }
  pcVar21 = "2";
  if (fCompact == 0) {
    pcVar21 = "";
  }
  iVar13 = p->vCis->nSize;
  iVar23 = p->vCos->nSize;
  uVar30 = ~(iVar23 + iVar13) + p->nObjs;
  uVar25 = p->nRegs;
  uVar20 = iVar23 - uVar25;
  if (p->nConstrs != 0) {
    uVar20 = 0;
  }
  fprintf(__stream,"aig%s %u %u %u %u %u",pcVar21,(ulong)(uVar30 + iVar13),(ulong)(iVar13 - uVar25),
          (ulong)uVar25,(ulong)uVar20,(ulong)uVar30);
  if (p->nConstrs != 0) {
    fprintf(__stream," %u %u",(ulong)(uint)(p->vCos->nSize - (p->nRegs + p->nConstrs)));
  }
  fputc(10,__stream);
  Gia_ManInvertConstraints(p);
  local_38 = pInit;
  if (fCompact == 0) {
    iVar13 = p->nRegs;
    if (0 < iVar13) {
      iVar23 = 0;
      do {
        iVar24 = p->vCos->nSize;
        uVar25 = (iVar24 - iVar13) + iVar23;
        if (((int)uVar25 < 0) || (iVar24 <= (int)uVar25)) goto LAB_0067fef2;
        iVar24 = p->vCos->pArray[uVar25];
        if (((long)iVar24 < 0) || (p->nObjs <= iVar24)) goto LAB_0067fed3;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        uVar25 = *(uint *)(p->pObjs + iVar24);
        iVar24 = iVar24 - (uVar25 & 0x1fffffff);
        if (iVar24 < 0) goto LAB_0067ff11;
        fprintf(__stream,"%u\n",(ulong)((uVar25 >> 0x1d & 1) + iVar24 * 2));
        iVar23 = iVar23 + 1;
        iVar13 = p->nRegs;
      } while (iVar23 < iVar13);
    }
    pVVar16 = p->vCos;
    uVar31 = (ulong)(uint)pVVar16->nSize;
    if (iVar13 < pVVar16->nSize) {
      lVar22 = 0;
      do {
        if ((int)uVar31 <= lVar22) goto LAB_0067fef2;
        iVar13 = pVVar16->pArray[lVar22];
        if (((long)iVar13 < 0) || (p->nObjs <= iVar13)) goto LAB_0067fed3;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        uVar25 = *(uint *)(p->pObjs + iVar13);
        iVar13 = iVar13 - (uVar25 & 0x1fffffff);
        if (iVar13 < 0) goto LAB_0067ff11;
        fprintf(__stream,"%u\n",(ulong)((uVar25 >> 0x1d & 1) + iVar13 * 2));
        lVar22 = lVar22 + 1;
        pVVar16 = p->vCos;
        uVar31 = (ulong)pVVar16->nSize;
      } while (lVar22 < (long)(uVar31 - (long)p->nRegs));
    }
  }
  else {
    pVVar16 = Gia_AigerCollectLiterals(p);
    pVVar17 = Gia_AigerWriteLiterals(pVVar16);
    pcVar21 = pVVar17->pArray;
    fwrite(pcVar21,1,(long)pVVar17->nSize,__stream);
    if (pcVar21 != (char *)0x0) {
      free(pcVar21);
    }
    free(pVVar17);
    if (pVVar16->pArray != (int *)0x0) {
      free(pVVar16->pArray);
    }
    free(pVVar16);
  }
  Gia_ManInvertConstraints(p);
  iVar13 = p->nObjs;
  iVar23 = ~(p->vCos->nSize + p->vCis->nSize) + iVar13;
  iVar24 = iVar23 * 8 + 100;
  __ptr = malloc((long)iVar24);
  if ((long)iVar13 < 1) {
LAB_0067eab2:
    iVar15 = 0;
  }
  else {
    pGVar1 = p->pObjs;
    lVar22 = 0;
    iVar15 = 0;
    do {
      if (pGVar1 == (Gia_Obj_t *)0x0) goto LAB_0067eab2;
      uVar31 = *(ulong *)(pGVar1 + lVar22);
      uVar25 = (uint)uVar31;
      if ((~uVar25 & 0x1fffffff) != 0 && -1 < (int)uVar25) {
        iVar14 = (int)lVar22;
        iVar26 = iVar14 - (uVar25 & 0x1fffffff);
        if (iVar26 < 0) {
LAB_0067ff11:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf1,"int Abc_Var2Lit(int, int)");
        }
        uVar25 = (uint)(uVar31 >> 0x20);
        iVar27 = iVar14 - (uVar25 & 0x1fffffff);
        if (iVar27 < 0) goto LAB_0067ff11;
        uVar20 = ((uint)(uVar31 >> 0x1d) & 1) + iVar26 * 2;
        uVar25 = (uVar25 >> 0x1d & 1) + iVar27 * 2;
        if (((p->fGiaSimple == 0) && (p->nBufs == 0)) && (uVar25 <= uVar20)) {
          __assert_fail("p->fGiaSimple || Gia_ManBufNum(p) || uLit0 < uLit1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaAiger.c"
                        ,0x48a,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int)");
        }
        uVar30 = iVar14 * 2 - uVar25;
        if (0x7f < uVar30) {
          pbVar28 = (byte *)((long)iVar15 + (long)__ptr);
          uVar29 = uVar30;
          do {
            *pbVar28 = (byte)uVar29 | 0x80;
            uVar30 = uVar29 >> 7;
            pbVar28 = pbVar28 + 1;
            iVar15 = iVar15 + 1;
            bVar2 = 0x3fff < uVar29;
            uVar29 = uVar30;
          } while (bVar2);
        }
        iVar14 = iVar15 + 1;
        *(char *)((long)__ptr + (long)iVar15) = (char)uVar30;
        uVar25 = uVar25 - uVar20;
        if (0x7f < uVar25) {
          pbVar28 = (byte *)((long)iVar14 + (long)__ptr);
          uVar20 = uVar25;
          do {
            *pbVar28 = (byte)uVar20 | 0x80;
            uVar25 = uVar20 >> 7;
            pbVar28 = pbVar28 + 1;
            iVar14 = iVar14 + 1;
            bVar2 = 0x3fff < uVar20;
            uVar20 = uVar25;
          } while (bVar2);
        }
        *(char *)((long)__ptr + (long)iVar14) = (char)uVar25;
        if (iVar23 * 8 + 0x5a <= iVar14) {
          puts(
              "Gia_AigerWrite(): AIGER generation has failed because the allocated buffer is too small."
              );
          fclose(__stream);
          if (p == local_38) {
            return;
          }
          goto LAB_0067fe93;
        }
        iVar15 = iVar14 + 1;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != iVar13);
  }
  if (iVar24 <= iVar15) {
    __assert_fail("Pos < nBufferSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaAiger.c"
                  ,0x496,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int)");
  }
  fwrite(__ptr,1,(long)iVar15,__stream);
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  if ((p->vNamesIn != (Vec_Ptr_t *)0x0) && (p->vNamesOut != (Vec_Ptr_t *)0x0)) {
    iVar13 = p->vNamesIn->nSize;
    pVVar16 = p->vCis;
    if (iVar13 != pVVar16->nSize) {
      __assert_fail("Vec_PtrSize(p->vNamesIn) == Gia_ManCiNum(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaAiger.c"
                    ,0x49f,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int)");
    }
    if (p->vNamesOut->nSize != p->vCos->nSize) {
      __assert_fail("Vec_PtrSize(p->vNamesOut) == Gia_ManCoNum(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaAiger.c"
                    ,0x4a0,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int)");
    }
    iVar23 = p->nRegs;
    if (iVar23 < iVar13) {
      uVar31 = 0;
      do {
        if ((long)iVar13 <= (long)uVar31) goto LAB_0067fef2;
        if ((pVVar16->pArray[uVar31] < 0) || (p->nObjs <= pVVar16->pArray[uVar31]))
        goto LAB_0067fed3;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        if ((long)p->vNamesIn->nSize <= (long)uVar31) goto LAB_0067ff30;
        fprintf(__stream,"i%d %s\n",uVar31 & 0xffffffff,p->vNamesIn->pArray[uVar31]);
        uVar31 = uVar31 + 1;
        iVar23 = p->nRegs;
        pVVar16 = p->vCis;
        iVar13 = pVVar16->nSize;
      } while ((long)uVar31 < (long)(iVar13 - iVar23));
    }
    if (0 < iVar23) {
      uVar25 = 0;
      do {
        iVar13 = p->vCis->nSize;
        uVar20 = (iVar13 - iVar23) + uVar25;
        if (((int)uVar20 < 0) || (iVar13 <= (int)uVar20)) goto LAB_0067fef2;
        iVar13 = p->vCis->pArray[uVar20];
        if ((iVar13 < 0) || (p->nObjs <= iVar13)) goto LAB_0067fed3;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        if (p->vNamesIn->nSize <= (int)uVar20) goto LAB_0067ff30;
        fprintf(__stream,"l%d %s\n",(ulong)uVar25,p->vNamesIn->pArray[uVar20]);
        uVar25 = uVar25 + 1;
        iVar23 = p->nRegs;
      } while ((int)uVar25 < iVar23);
    }
    pVVar16 = p->vCos;
    uVar31 = (ulong)(uint)pVVar16->nSize;
    if (iVar23 < pVVar16->nSize) {
      uVar32 = 0;
      do {
        if ((long)(int)uVar31 <= (long)uVar32) {
LAB_0067fef2:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if ((pVVar16->pArray[uVar32] < 0) || (p->nObjs <= pVVar16->pArray[uVar32])) {
LAB_0067fed3:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        if ((long)p->vNamesOut->nSize <= (long)uVar32) {
LAB_0067ff30:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        fprintf(__stream,"o%d %s\n",uVar32 & 0xffffffff,p->vNamesOut->pArray[uVar32]);
        uVar32 = uVar32 + 1;
        pVVar16 = p->vCos;
        uVar31 = (ulong)pVVar16->nSize;
      } while ((long)uVar32 < (long)(uVar31 - (long)p->nRegs));
    }
  }
  fputc(99,__stream);
  if (p->pAigExtra != (Gia_Man_t *)0x0) {
    fputc(0x61,__stream);
    pVVar17 = Gia_AigerWriteIntoMemoryStr(p->pAigExtra);
    uVar25 = pVVar17->nSize;
    uVar8 = (ushort)(uVar25 >> 0x10) & 0xff;
    uVar9 = (ushort)(uVar25 >> 8) & 0xff;
    uVar10 = (ushort)uVar25 & 0xff;
    bVar4 = (byte)(uVar25 >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar3 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar4 = ((uVar25 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar25 >> 0x10) - (0xff < uVar8);
    bVar5 = ((uVar25 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar9);
    bVar6 = ((uVar25 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar25 - (0xff < uVar10);
    local_40[0] = CONCAT13((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                           CONCAT12((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                                    CONCAT11((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4)
                                             ,(bVar3 != 0) * (bVar3 < 0x100) * bVar3 -
                                              (0xff < bVar3))));
    fwrite(local_40,1,4,__stream);
    fwrite(pVVar17->pArray,1,(long)pVVar17->nSize,__stream);
    if (pVVar17->pArray != (char *)0x0) {
      free(pVVar17->pArray);
    }
    free(pVVar17);
  }
  if (p->nConstrs != 0) {
    fputc(99,__stream);
    local_40[0] = 0x4000000;
    fwrite(local_40,1,4,__stream);
    uVar25 = p->nConstrs;
    uVar8 = (ushort)(uVar25 >> 0x10) & 0xff;
    uVar9 = (ushort)(uVar25 >> 8) & 0xff;
    uVar10 = (ushort)uVar25 & 0xff;
    bVar4 = (byte)(uVar25 >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar5 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar6 = ((uVar25 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar25 >> 0x10) - (0xff < uVar8);
    bVar4 = ((uVar25 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar9);
    bVar3 = ((uVar25 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar25 - (0xff < uVar10);
    local_40[0] = CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                           CONCAT12((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                                    CONCAT11((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6)
                                             ,(bVar5 != 0) * (bVar5 < 0x100) * bVar5 -
                                              (0xff < bVar5))));
    fwrite(local_40,1,4,__stream);
  }
  if (p->nAnd2Delay != 0) {
    fputc(100,__stream);
    local_40[0] = 0x4000000;
    fwrite(local_40,1,4,__stream);
    uVar25 = p->nAnd2Delay;
    uVar8 = (ushort)(uVar25 >> 0x10) & 0xff;
    uVar9 = (ushort)(uVar25 >> 8) & 0xff;
    uVar10 = (ushort)uVar25 & 0xff;
    bVar4 = (byte)(uVar25 >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar5 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar4 = ((uVar25 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar25 >> 0x10) - (0xff < uVar8);
    bVar3 = ((uVar25 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar9);
    bVar6 = ((uVar25 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar25 - (0xff < uVar10);
    local_40[0] = CONCAT13((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                           CONCAT12((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                                    CONCAT11((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4)
                                             ,(bVar5 != 0) * (bVar5 < 0x100) * bVar5 -
                                              (0xff < bVar5))));
    fwrite(local_40,1,4,__stream);
  }
  if ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) {
    pfVar18 = Tim_ManGetArrTimes((Tim_Man_t *)p->pManTime);
    if (pfVar18 != (float *)0x0) {
      fputc(0x69,__stream);
      iVar13 = Tim_ManPiNum((Tim_Man_t *)p->pManTime);
      uVar25 = iVar13 << 2;
      uVar20 = iVar13 << 2;
      uVar30 = iVar13 * 4;
      uVar8 = (ushort)(uVar25 >> 0x10) & 0xff;
      uVar9 = (ushort)(uVar20 >> 8) & 0xff;
      uVar10 = (ushort)uVar30 & 0xff;
      bVar4 = (byte)((uint)(iVar13 << 2) >> 0x18);
      uVar7 = (ushort)bVar4;
      bVar5 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
      bVar4 = ((uVar25 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar25 >> 0x10) - (0xff < uVar8)
      ;
      bVar3 = ((uVar20 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar20 >> 8) - (0xff < uVar9);
      bVar6 = ((uVar30 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar30 - (0xff < uVar10);
      local_40[0] = CONCAT13((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                             CONCAT12((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                                      CONCAT11((bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                               (0xff < bVar4),
                                               (bVar5 != 0) * (bVar5 < 0x100) * bVar5 -
                                               (0xff < bVar5))));
      fwrite(local_40,1,4,__stream);
      iVar13 = Tim_ManPiNum((Tim_Man_t *)p->pManTime);
      fwrite(pfVar18,1,(long)(iVar13 << 2),__stream);
      free(pfVar18);
    }
    pfVar18 = Tim_ManGetReqTimes((Tim_Man_t *)p->pManTime);
    if (pfVar18 != (float *)0x0) {
      fputc(0x6f,__stream);
      iVar13 = Tim_ManPoNum((Tim_Man_t *)p->pManTime);
      uVar25 = iVar13 << 2;
      uVar20 = iVar13 << 2;
      uVar30 = iVar13 * 4;
      uVar8 = (ushort)(uVar25 >> 0x10) & 0xff;
      uVar9 = (ushort)(uVar20 >> 8) & 0xff;
      uVar10 = (ushort)uVar30 & 0xff;
      bVar4 = (byte)((uint)(iVar13 << 2) >> 0x18);
      uVar7 = (ushort)bVar4;
      bVar3 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
      bVar4 = ((uVar25 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar25 >> 0x10) - (0xff < uVar8)
      ;
      bVar5 = ((uVar20 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar20 >> 8) - (0xff < uVar9);
      bVar6 = ((uVar30 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar30 - (0xff < uVar10);
      local_40[0] = CONCAT13((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                             CONCAT12((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                                      CONCAT11((bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                               (0xff < bVar4),
                                               (bVar3 != 0) * (bVar3 < 0x100) * bVar3 -
                                               (0xff < bVar3))));
      fwrite(local_40,1,4,__stream);
      iVar13 = Tim_ManPoNum((Tim_Man_t *)p->pManTime);
      fwrite(pfVar18,1,(long)(iVar13 << 2),__stream);
      free(pfVar18);
    }
  }
  if ((p->pReprs != (Gia_Rpr_t *)0x0) && (p->pNexts != (int *)0x0)) {
    fputc(0x65,__stream);
    pVVar17 = Gia_WriteEquivClasses(p);
    uVar25 = pVVar17->nSize;
    uVar8 = (ushort)(uVar25 >> 0x10) & 0xff;
    uVar9 = (ushort)(uVar25 >> 8) & 0xff;
    uVar10 = (ushort)uVar25 & 0xff;
    bVar4 = (byte)(uVar25 >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar4 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar5 = ((uVar25 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar25 >> 0x10) - (0xff < uVar8);
    bVar6 = ((uVar25 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar9);
    bVar3 = ((uVar25 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar25 - (0xff < uVar10);
    local_40[0] = CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                           CONCAT12((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                    CONCAT11((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5)
                                             ,(bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                              (0xff < bVar4))));
    fwrite(local_40,1,4,__stream);
    fwrite(pVVar17->pArray,1,(long)pVVar17->nSize,__stream);
    if (pVVar17->pArray != (char *)0x0) {
      free(pVVar17->pArray);
    }
    free(pVVar17);
  }
  if (p->vFlopClasses != (Vec_Int_t *)0x0) {
    fputc(0x66,__stream);
    iVar13 = p->nRegs;
    uVar25 = iVar13 << 2;
    uVar20 = iVar13 << 2;
    uVar30 = iVar13 * 4;
    uVar8 = (ushort)(uVar25 >> 0x10) & 0xff;
    uVar9 = (ushort)(uVar20 >> 8) & 0xff;
    uVar10 = (ushort)uVar30 & 0xff;
    bVar4 = (byte)((uint)(iVar13 << 2) >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar3 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar6 = ((uVar25 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar25 >> 0x10) - (0xff < uVar8);
    bVar4 = ((uVar20 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar20 >> 8) - (0xff < uVar9);
    bVar5 = ((uVar30 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar30 - (0xff < uVar10);
    local_40[0] = CONCAT13((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                           CONCAT12((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                                    CONCAT11((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6)
                                             ,(bVar3 != 0) * (bVar3 < 0x100) * bVar3 -
                                              (0xff < bVar3))));
    fwrite(local_40,1,4,__stream);
    iVar13 = p->vFlopClasses->nSize;
    if (iVar13 != p->nRegs) {
      __assert_fail("Vec_IntSize(p->vFlopClasses) == Gia_ManRegNum(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaAiger.c"
                    ,0x4ed,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int)");
    }
    fwrite(p->vFlopClasses->pArray,1,(long)iVar13 << 2,__stream);
  }
  if (p->vGateClasses != (Vec_Int_t *)0x0) {
    fputc(0x67,__stream);
    iVar13 = p->nObjs;
    uVar25 = iVar13 << 2;
    uVar20 = iVar13 << 2;
    uVar30 = iVar13 * 4;
    uVar8 = (ushort)(uVar25 >> 0x10) & 0xff;
    uVar9 = (ushort)(uVar20 >> 8) & 0xff;
    uVar10 = (ushort)uVar30 & 0xff;
    bVar4 = (byte)((uint)(iVar13 << 2) >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar3 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar6 = ((uVar25 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar25 >> 0x10) - (0xff < uVar8);
    bVar5 = ((uVar20 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar20 >> 8) - (0xff < uVar9);
    bVar4 = ((uVar30 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar30 - (0xff < uVar10);
    local_40[0] = CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                           CONCAT12((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                                    CONCAT11((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6)
                                             ,(bVar3 != 0) * (bVar3 < 0x100) * bVar3 -
                                              (0xff < bVar3))));
    fwrite(local_40,1,4,__stream);
    iVar13 = p->vGateClasses->nSize;
    if (iVar13 != p->nObjs) {
      __assert_fail("Vec_IntSize(p->vGateClasses) == Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaAiger.c"
                    ,0x4f5,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int)");
    }
    fwrite(p->vGateClasses->pArray,1,(long)iVar13 << 2,__stream);
  }
  if (p->pManTime != (void *)0x0) {
    fputc(0x68,__stream);
    pVVar17 = Tim_ManSave((Tim_Man_t *)p->pManTime,1);
    uVar25 = pVVar17->nSize;
    uVar8 = (ushort)(uVar25 >> 0x10) & 0xff;
    uVar9 = (ushort)(uVar25 >> 8) & 0xff;
    uVar10 = (ushort)uVar25 & 0xff;
    bVar4 = (byte)(uVar25 >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar5 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar6 = ((uVar25 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar25 >> 0x10) - (0xff < uVar8);
    bVar4 = ((uVar25 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar9);
    bVar3 = ((uVar25 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar25 - (0xff < uVar10);
    local_40[0] = CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                           CONCAT12((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                                    CONCAT11((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6)
                                             ,(bVar5 != 0) * (bVar5 < 0x100) * bVar5 -
                                              (0xff < bVar5))));
    fwrite(local_40,1,4,__stream);
    fwrite(pVVar17->pArray,1,(long)pVVar17->nSize,__stream);
    if (pVVar17->pArray != (char *)0x0) {
      free(pVVar17->pArray);
    }
    free(pVVar17);
  }
  if (p->vPacking != (Vec_Int_t *)0x0) {
    fputc(0x6b,__stream);
    pVVar17 = Gia_WritePacking(p->vPacking);
    uVar25 = pVVar17->nSize;
    uVar8 = (ushort)(uVar25 >> 0x10) & 0xff;
    uVar9 = (ushort)(uVar25 >> 8) & 0xff;
    uVar10 = (ushort)uVar25 & 0xff;
    bVar4 = (byte)(uVar25 >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar4 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar5 = ((uVar25 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar25 >> 0x10) - (0xff < uVar8);
    bVar3 = ((uVar25 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar9);
    bVar6 = ((uVar25 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar25 - (0xff < uVar10);
    local_40[0] = CONCAT13((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                           CONCAT12((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                                    CONCAT11((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5)
                                             ,(bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                              (0xff < bVar4))));
    fwrite(local_40,1,4,__stream);
    fwrite(pVVar17->pArray,1,(long)pVVar17->nSize,__stream);
    if (pVVar17->pArray != (char *)0x0) {
      free(pVVar17->pArray);
    }
    free(pVVar17);
  }
  if (p->vEdge1 != (Vec_Int_t *)0x0) {
    pVVar16 = Gia_ManEdgeToArray(p);
    fputc(0x77,__stream);
    uVar25 = pVVar16->nSize * 4 + 4;
    uVar8 = (ushort)((uVar25 & 0xff00ff) >> 0x10);
    uVar9 = (ushort)(uVar25 >> 8) & 0xff;
    uVar10 = (ushort)(uVar25 & 0xff00ff);
    bVar4 = (byte)(uVar25 >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar5 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar3 = ((uVar25 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar25 >> 0x10) - (0xff < uVar8);
    bVar4 = ((uVar25 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar9);
    bVar6 = ((uVar25 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar25 - (0xff < uVar10);
    local_40[0] = CONCAT13((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                           CONCAT12((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                                    CONCAT11((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3)
                                             ,(bVar5 != 0) * (bVar5 < 0x100) * bVar5 -
                                              (0xff < bVar5))));
    fwrite(local_40,1,4,__stream);
    iVar13 = pVVar16->nSize;
    uVar25 = iVar13 / 2;
    uVar20 = iVar13 / 2;
    uVar30 = iVar13 / 2;
    uVar8 = (ushort)(uVar25 >> 0x10) & 0xff;
    uVar9 = (ushort)(uVar20 >> 8) & 0xff;
    uVar10 = (ushort)uVar30 & 0xff;
    bVar4 = (byte)((uint)(iVar13 / 2) >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar3 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar6 = ((uVar25 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar25 >> 0x10) - (0xff < uVar8);
    bVar5 = ((uVar20 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar20 >> 8) - (0xff < uVar9);
    bVar4 = ((uVar30 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar30 - (0xff < uVar10);
    local_40[0] = CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                           CONCAT12((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                                    CONCAT11((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6)
                                             ,(bVar3 != 0) * (bVar3 < 0x100) * bVar3 -
                                              (0xff < bVar3))));
    fwrite(local_40,1,4,__stream);
    if (0 < pVVar16->nSize) {
      lVar22 = 0;
      do {
        uVar25 = pVVar16->pArray[lVar22];
        uVar8 = (ushort)(uVar25 >> 0x10) & 0xff;
        uVar9 = (ushort)(uVar25 >> 8) & 0xff;
        uVar10 = (ushort)uVar25 & 0xff;
        bVar4 = (byte)(uVar25 >> 0x18);
        uVar7 = (ushort)bVar4;
        bVar4 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
        bVar5 = ((uVar25 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar25 >> 0x10) -
                (0xff < uVar8);
        bVar6 = ((uVar25 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar9);
        bVar3 = ((uVar25 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar25 - (0xff < uVar10);
        local_40[0] = CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                               CONCAT12((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                        CONCAT11((bVar5 != 0) * (bVar5 < 0x100) * bVar5 -
                                                 (0xff < bVar5),
                                                 (bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                                 (0xff < bVar4))));
        fwrite(local_40,1,4,__stream);
        lVar22 = lVar22 + 1;
      } while (lVar22 < pVVar16->nSize);
    }
    if (pVVar16->pArray != (int *)0x0) {
      free(pVVar16->pArray);
    }
    free(pVVar16);
  }
  if (p->vMapping != (Vec_Int_t *)0x0) {
    fputc(0x6d,__stream);
    pVVar17 = Gia_AigerWriteMappingDoc(p);
    uVar25 = pVVar17->nSize;
    uVar8 = (ushort)(uVar25 >> 0x10) & 0xff;
    uVar9 = (ushort)(uVar25 >> 8) & 0xff;
    uVar10 = (ushort)uVar25 & 0xff;
    bVar4 = (byte)(uVar25 >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar4 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar5 = ((uVar25 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar25 >> 0x10) - (0xff < uVar8);
    bVar6 = ((uVar25 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar9);
    bVar3 = ((uVar25 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar25 - (0xff < uVar10);
    local_40[0] = CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                           CONCAT12((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                    CONCAT11((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5)
                                             ,(bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                              (0xff < bVar4))));
    fwrite(local_40,1,4,__stream);
    fwrite(pVVar17->pArray,1,(long)pVVar17->nSize,__stream);
    if (pVVar17->pArray != (char *)0x0) {
      free(pVVar17->pArray);
    }
    free(pVVar17);
  }
  if (p->pPlacement != (Gia_Plc_t *)0x0) {
    fputc(0x70,__stream);
    iVar13 = p->nObjs;
    uVar25 = iVar13 << 2;
    uVar20 = iVar13 << 2;
    uVar30 = iVar13 * 4;
    uVar8 = (ushort)(uVar25 >> 0x10) & 0xff;
    uVar9 = (ushort)(uVar20 >> 8) & 0xff;
    uVar10 = (ushort)uVar30 & 0xff;
    bVar4 = (byte)((uint)(iVar13 << 2) >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar4 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar5 = ((uVar25 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar25 >> 0x10) - (0xff < uVar8);
    bVar6 = ((uVar20 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar20 >> 8) - (0xff < uVar9);
    bVar3 = ((uVar30 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar30 - (0xff < uVar10);
    local_40[0] = CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                           CONCAT12((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                    CONCAT11((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5)
                                             ,(bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                              (0xff < bVar4))));
    fwrite(local_40,1,4,__stream);
    fwrite(p->pPlacement,1,(long)p->nObjs << 2,__stream);
  }
  if (p->vRegClasses != (Vec_Int_t *)0x0) {
    fputc(0x72,__stream);
    uVar25 = p->vRegClasses->nSize * 4 + 4;
    uVar8 = (ushort)((uVar25 & 0xff00ff) >> 0x10);
    uVar9 = (ushort)(uVar25 >> 8) & 0xff;
    uVar10 = (ushort)(uVar25 & 0xff00ff);
    bVar4 = (byte)(uVar25 >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar5 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar3 = ((uVar25 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar25 >> 0x10) - (0xff < uVar8);
    bVar4 = ((uVar25 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar9);
    bVar6 = ((uVar25 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar25 - (0xff < uVar10);
    local_40[0] = CONCAT13((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                           CONCAT12((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                                    CONCAT11((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3)
                                             ,(bVar5 != 0) * (bVar5 < 0x100) * bVar5 -
                                              (0xff < bVar5))));
    fwrite(local_40,1,4,__stream);
    uVar25 = p->vRegClasses->nSize;
    uVar8 = (ushort)(uVar25 >> 0x10) & 0xff;
    uVar9 = (ushort)(uVar25 >> 8) & 0xff;
    uVar10 = (ushort)uVar25 & 0xff;
    bVar4 = (byte)(uVar25 >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar3 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar6 = ((uVar25 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar25 >> 0x10) - (0xff < uVar8);
    bVar5 = ((uVar25 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar9);
    bVar4 = ((uVar25 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar25 - (0xff < uVar10);
    local_40[0] = CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                           CONCAT12((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                                    CONCAT11((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6)
                                             ,(bVar3 != 0) * (bVar3 < 0x100) * bVar3 -
                                              (0xff < bVar3))));
    fwrite(local_40,1,4,__stream);
    pVVar16 = p->vRegClasses;
    if (0 < pVVar16->nSize) {
      lVar22 = 0;
      do {
        uVar25 = pVVar16->pArray[lVar22];
        uVar8 = (ushort)(uVar25 >> 0x10) & 0xff;
        uVar9 = (ushort)(uVar25 >> 8) & 0xff;
        uVar10 = (ushort)uVar25 & 0xff;
        bVar4 = (byte)(uVar25 >> 0x18);
        uVar7 = (ushort)bVar4;
        bVar3 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
        bVar6 = ((uVar25 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar25 >> 0x10) -
                (0xff < uVar8);
        bVar5 = ((uVar25 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar9);
        bVar4 = ((uVar25 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar25 - (0xff < uVar10);
        local_40[0] = CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                               CONCAT12((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                                        CONCAT11((bVar6 != 0) * (bVar6 < 0x100) * bVar6 -
                                                 (0xff < bVar6),
                                                 (bVar3 != 0) * (bVar3 < 0x100) * bVar3 -
                                                 (0xff < bVar3))));
        fwrite(local_40,1,4,__stream);
        lVar22 = lVar22 + 1;
        pVVar16 = p->vRegClasses;
      } while (lVar22 < pVVar16->nSize);
    }
  }
  if (p->vRegInits != (Vec_Int_t *)0x0) {
    fputc(0x73,__stream);
    uVar25 = p->vRegInits->nSize * 4 + 4;
    uVar8 = (ushort)((uVar25 & 0xff00ff) >> 0x10);
    uVar9 = (ushort)(uVar25 >> 8) & 0xff;
    uVar10 = (ushort)(uVar25 & 0xff00ff);
    bVar4 = (byte)(uVar25 >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar5 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar6 = ((uVar25 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar25 >> 0x10) - (0xff < uVar8);
    bVar3 = ((uVar25 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar9);
    bVar4 = ((uVar25 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar25 - (0xff < uVar10);
    local_40[0] = CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                           CONCAT12((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                                    CONCAT11((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6)
                                             ,(bVar5 != 0) * (bVar5 < 0x100) * bVar5 -
                                              (0xff < bVar5))));
    fwrite(local_40,1,4,__stream);
    uVar25 = p->vRegInits->nSize;
    uVar8 = (ushort)(uVar25 >> 0x10) & 0xff;
    uVar9 = (ushort)(uVar25 >> 8) & 0xff;
    uVar10 = (ushort)uVar25 & 0xff;
    bVar4 = (byte)(uVar25 >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar5 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar6 = ((uVar25 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar25 >> 0x10) - (0xff < uVar8);
    bVar3 = ((uVar25 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar9);
    bVar4 = ((uVar25 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar25 - (0xff < uVar10);
    local_40[0] = CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                           CONCAT12((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                                    CONCAT11((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6)
                                             ,(bVar5 != 0) * (bVar5 < 0x100) * bVar5 -
                                              (0xff < bVar5))));
    fwrite(local_40,1,4,__stream);
    pVVar16 = p->vRegInits;
    if (0 < pVVar16->nSize) {
      lVar22 = 0;
      do {
        uVar25 = pVVar16->pArray[lVar22];
        uVar8 = (ushort)(uVar25 >> 0x10) & 0xff;
        uVar9 = (ushort)(uVar25 >> 8) & 0xff;
        uVar10 = (ushort)uVar25 & 0xff;
        bVar4 = (byte)(uVar25 >> 0x18);
        uVar7 = (ushort)bVar4;
        bVar3 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
        bVar6 = ((uVar25 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar25 >> 0x10) -
                (0xff < uVar8);
        bVar5 = ((uVar25 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar9);
        bVar4 = ((uVar25 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar25 - (0xff < uVar10);
        local_40[0] = CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                               CONCAT12((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                                        CONCAT11((bVar6 != 0) * (bVar6 < 0x100) * bVar6 -
                                                 (0xff < bVar6),
                                                 (bVar3 != 0) * (bVar3 < 0x100) * bVar3 -
                                                 (0xff < bVar3))));
        fwrite(local_40,1,4,__stream);
        lVar22 = lVar22 + 1;
        pVVar16 = p->vRegInits;
      } while (lVar22 < pVVar16->nSize);
    }
  }
  if (p->vConfigs != (Vec_Int_t *)0x0) {
    fputc(0x62,__stream);
    if (p->pCellStr == (char *)0x0) {
      __assert_fail("p->pCellStr != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaAiger.c"
                    ,0x545,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int)");
    }
    iVar13 = p->vConfigs->nSize;
    sVar19 = strlen(p->pCellStr);
    uVar25 = (int)sVar19 + iVar13 * 4 + 1;
    uVar8 = (ushort)((uVar25 & 0xff00ff) >> 0x10);
    uVar9 = (ushort)(uVar25 >> 8) & 0xff;
    uVar10 = (ushort)(uVar25 & 0xff00ff);
    bVar4 = (byte)(uVar25 >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar4 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar5 = ((uVar25 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar25 >> 0x10) - (0xff < uVar8);
    bVar6 = ((uVar25 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar9);
    bVar3 = ((uVar25 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar25 - (0xff < uVar10);
    local_40[0] = CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                           CONCAT12((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                    CONCAT11((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5)
                                             ,(bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                              (0xff < bVar4))));
    fwrite(local_40,1,4,__stream);
    pcVar21 = p->pCellStr;
    sVar19 = strlen(pcVar21);
    fwrite(pcVar21,1,sVar19 + 1,__stream);
    pVVar16 = p->vConfigs;
    if (0 < pVVar16->nSize) {
      lVar22 = 0;
      do {
        uVar25 = pVVar16->pArray[lVar22];
        uVar8 = (ushort)(uVar25 >> 0x10) & 0xff;
        uVar9 = (ushort)(uVar25 >> 8) & 0xff;
        uVar10 = (ushort)uVar25 & 0xff;
        bVar4 = (byte)(uVar25 >> 0x18);
        uVar7 = (ushort)bVar4;
        bVar4 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
        bVar5 = ((uVar25 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar25 >> 0x10) -
                (0xff < uVar8);
        bVar6 = ((uVar25 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar9);
        bVar3 = ((uVar25 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar25 - (0xff < uVar10);
        local_40[0] = CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                               CONCAT12((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                        CONCAT11((bVar5 != 0) * (bVar5 < 0x100) * bVar5 -
                                                 (0xff < bVar5),
                                                 (bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                                 (0xff < bVar4))));
        fwrite(local_40,1,4,__stream);
        lVar22 = lVar22 + 1;
        pVVar16 = p->vConfigs;
      } while (lVar22 < pVVar16->nSize);
    }
  }
  if (p->pSibls != (int *)0x0) {
    fputc(0x71,__stream);
    if ((long)p->nObjs < 1) {
      uVar25 = 0;
    }
    else {
      lVar22 = 0;
      uVar25 = 0;
      do {
        uVar20 = 0;
        if (p->pSibls != (int *)0x0) {
          uVar20 = (uint)(0 < p->pSibls[lVar22]);
        }
        uVar25 = uVar25 + uVar20;
        lVar22 = lVar22 + 1;
      } while (p->nObjs != lVar22);
    }
    uVar20 = uVar25 * 8 + 4;
    uVar8 = (ushort)((uVar20 & 0xff00ff) >> 0x10);
    uVar9 = (ushort)(uVar20 >> 8) & 0xff;
    uVar10 = (ushort)(uVar20 & 0xff00ff);
    bVar4 = (byte)(uVar20 >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar4 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar5 = ((uVar20 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar20 >> 0x10) - (0xff < uVar8);
    bVar6 = ((uVar20 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar20 >> 8) - (0xff < uVar9);
    bVar3 = ((uVar20 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar20 - (0xff < uVar10);
    local_40[0] = CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                           CONCAT12((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                    CONCAT11((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5)
                                             ,(bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                              (0xff < bVar4))));
    fwrite(local_40,1,4,__stream);
    uVar8 = (ushort)(uVar25 >> 0x10) & 0xff;
    uVar9 = (ushort)(uVar25 >> 8) & 0xff;
    uVar10 = (ushort)uVar25 & 0xff;
    bVar4 = (byte)(uVar25 >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar4 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar5 = ((uVar25 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar25 >> 0x10) - (0xff < uVar8);
    bVar6 = ((uVar25 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar9);
    bVar3 = ((uVar25 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar25 - (0xff < uVar10);
    local_40[0] = CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                           CONCAT12((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                    CONCAT11((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5)
                                             ,(bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                              (0xff < bVar4))));
    fwrite(local_40,1,4,__stream);
    iVar13 = p->nObjs;
    if (0 < iVar13) {
      uVar31 = 0;
      do {
        if ((p->pSibls != (int *)0x0) && (lVar22 = (long)p->pSibls[uVar31], lVar22 != 0)) {
          if ((long)uVar31 <= lVar22) {
            __assert_fail("i > Gia_ObjSibl(p, i)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaAiger.c"
                          ,0x558,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int)");
          }
          uVar8 = (ushort)(uVar31 >> 0x10) & 0xff;
          uVar9 = (ushort)(uVar31 >> 8) & 0xff;
          uVar10 = (ushort)uVar31 & 0xff;
          bVar4 = (byte)(uVar31 >> 0x18);
          uVar7 = (ushort)bVar4;
          bVar4 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
          bVar5 = ((uVar31 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar31 >> 0x10) -
                  (0xff < uVar8);
          bVar6 = ((uVar31 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar31 >> 8) - (0xff < uVar9);
          bVar3 = ((uVar31 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar31 - (0xff < uVar10);
          local_40[0] = CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                                 CONCAT12((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                          CONCAT11((bVar5 != 0) * (bVar5 < 0x100) * bVar5 -
                                                   (0xff < bVar5),
                                                   (bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                                   (0xff < bVar4))));
          fwrite(local_40,1,4,__stream);
          if (p->pSibls == (int *)0x0) {
            uVar25 = 0;
          }
          else {
            uVar25 = p->pSibls[uVar31];
          }
          uVar8 = (ushort)(uVar25 >> 0x10) & 0xff;
          uVar9 = (ushort)(uVar25 >> 8) & 0xff;
          uVar10 = (ushort)uVar25 & 0xff;
          bVar4 = (byte)(uVar25 >> 0x18);
          uVar7 = (ushort)bVar4;
          bVar4 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
          bVar5 = ((uVar25 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar25 >> 0x10) -
                  (0xff < uVar8);
          bVar6 = ((uVar25 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar9);
          bVar3 = ((uVar25 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar25 - (0xff < uVar10);
          local_40[0] = CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                                 CONCAT12((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                          CONCAT11((bVar5 != 0) * (bVar5 < 0x100) * bVar5 -
                                                   (0xff < bVar5),
                                                   (bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                                   (0xff < bVar4))));
          fwrite(local_40,1,4,__stream);
          iVar13 = p->nObjs;
        }
        uVar31 = uVar31 + 1;
      } while ((long)uVar31 < (long)iVar13);
    }
  }
  if (p->pSwitching != (uchar *)0x0) {
    fputc(0x75,__stream);
    uVar25 = p->nObjs;
    uVar8 = (ushort)(uVar25 >> 0x10) & 0xff;
    uVar9 = (ushort)(uVar25 >> 8) & 0xff;
    uVar10 = (ushort)uVar25 & 0xff;
    bVar4 = (byte)(uVar25 >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar4 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar5 = ((uVar25 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar25 >> 0x10) - (0xff < uVar8);
    bVar6 = ((uVar25 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar9);
    bVar3 = ((uVar25 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar25 - (0xff < uVar10);
    local_40[0] = CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                           CONCAT12((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                    CONCAT11((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5)
                                             ,(bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                              (0xff < bVar4))));
    fwrite(local_40,1,4,__stream);
    fwrite(p->pSwitching,1,(long)p->nObjs,__stream);
  }
  pGVar12 = local_38;
  if (p->vObjClasses != (Vec_Int_t *)0x0) {
    fputc(0x76,__stream);
    iVar13 = p->nObjs;
    uVar25 = iVar13 << 2;
    uVar20 = iVar13 << 2;
    uVar30 = iVar13 * 4;
    uVar8 = (ushort)(uVar25 >> 0x10) & 0xff;
    uVar9 = (ushort)(uVar20 >> 8) & 0xff;
    uVar10 = (ushort)uVar30 & 0xff;
    bVar4 = (byte)((uint)(iVar13 << 2) >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar4 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar5 = ((uVar25 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar25 >> 0x10) - (0xff < uVar8);
    bVar6 = ((uVar20 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar20 >> 8) - (0xff < uVar9);
    bVar3 = ((uVar30 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar30 - (0xff < uVar10);
    local_40[0] = CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                           CONCAT12((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                    CONCAT11((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5)
                                             ,(bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                              (0xff < bVar4))));
    fwrite(local_40,1,4,__stream);
    iVar13 = p->vObjClasses->nSize;
    if (iVar13 != p->nObjs) {
      __assert_fail("Vec_IntSize(p->vObjClasses) == Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaAiger.c"
                    ,0x575,"void Gia_AigerWrite(Gia_Man_t *, char *, int, int)");
    }
    fwrite(p->vObjClasses->pArray,1,(long)iVar13 << 2,__stream);
  }
  if (p->pName != (char *)0x0) {
    fputc(0x6e,__stream);
    sVar19 = strlen(p->pName);
    uVar25 = (int)sVar19 + 1;
    uVar8 = (ushort)((uVar25 & 0xff00ff) >> 0x10);
    uVar9 = (ushort)(uVar25 >> 8) & 0xff;
    uVar10 = (ushort)(uVar25 & 0xff00ff);
    bVar4 = (byte)(uVar25 >> 0x18);
    uVar7 = (ushort)bVar4;
    bVar3 = (uVar7 != 0) * (uVar7 < 0x100) * bVar4 - (0xff < uVar7);
    bVar4 = ((uVar25 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar25 >> 0x10) - (0xff < uVar8);
    bVar6 = ((uVar25 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar9);
    bVar5 = ((uVar25 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar25 - (0xff < uVar10);
    local_40[0] = CONCAT13((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                           CONCAT12((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                    CONCAT11((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4)
                                             ,(bVar3 != 0) * (bVar3 < 0x100) * bVar3 -
                                              (0xff < bVar3))));
    fwrite(local_40,1,4,__stream);
    pcVar21 = p->pName;
    sVar19 = strlen(pcVar21);
    fwrite(pcVar21,1,sVar19,__stream);
    fputc(0,__stream);
  }
  pcVar21 = Gia_TimeStamp();
  fprintf(__stream,"\nThis file was produced by the GIA package in ABC on %s\n",pcVar21);
  fprintf(__stream,"For information about AIGER format, refer to %s\n","http://fmv.jku.at/aiger");
  fclose(__stream);
  if (p == pGVar12) {
    return;
  }
  pGVar12->pManTime = p->pManTime;
  p->pManTime = (void *)0x0;
  pVVar11 = p->vNamesOut;
  pGVar12->vNamesIn = p->vNamesIn;
  pGVar12->vNamesOut = pVVar11;
  p->vNamesIn = (Vec_Ptr_t *)0x0;
  p->vNamesOut = (Vec_Ptr_t *)0x0;
LAB_0067fe93:
  Gia_ManStop(p);
  return;
}

Assistant:

void Gia_AigerWrite( Gia_Man_t * pInit, char * pFileName, int fWriteSymbols, int fCompact )
{
    int fVerbose = XAIG_VERBOSE;
    FILE * pFile;
    Gia_Man_t * p;
    Gia_Obj_t * pObj;
    Vec_Str_t * vStrExt;
    int i, nBufferSize, Pos;
    unsigned char * pBuffer;
    unsigned uLit0, uLit1, uLit;
    assert( pInit->nXors == 0 && pInit->nMuxes == 0 );

    if ( Gia_ManCoNum(pInit) == 0 )
    {
        printf( "AIG cannot be written because it has no POs.\n" );
        return;
    }

    // start the output stream
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Gia_AigerWrite(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }

    // create normalized AIG
    if ( !Gia_ManIsNormalized(pInit) )
    {
//        printf( "Gia_AigerWrite(): Normalizing AIG for writing.\n" );
        p = Gia_ManDupNormalize( pInit, 0 );
		Gia_ManTransferMapping( p, pInit );
	    Gia_ManTransferPacking( p, pInit );
        Gia_ManTransferTiming( p, pInit );
        p->vNamesIn   = pInit->vNamesIn;   pInit->vNamesIn   = NULL;
        p->vNamesOut  = pInit->vNamesOut;  pInit->vNamesOut  = NULL;
        p->nConstrs   = pInit->nConstrs;   pInit->nConstrs   = 0;
    }
    else
        p = pInit;

    // write the header "M I L O A" where M = I + L + A
    fprintf( pFile, "aig%s %u %u %u %u %u", 
        fCompact? "2" : "",
        Gia_ManCiNum(p) + Gia_ManAndNum(p), 
        Gia_ManPiNum(p),
        Gia_ManRegNum(p),
        Gia_ManConstrNum(p) ? 0 : Gia_ManPoNum(p),
        Gia_ManAndNum(p) );
    // write the extended header "B C J F"
    if ( Gia_ManConstrNum(p) )
        fprintf( pFile, " %u %u", Gia_ManPoNum(p) - Gia_ManConstrNum(p), Gia_ManConstrNum(p) );
    fprintf( pFile, "\n" ); 

    Gia_ManInvertConstraints( p );
    if ( !fCompact ) 
    {
        // write latch drivers
        Gia_ManForEachRi( p, pObj, i )
            fprintf( pFile, "%u\n", Gia_ObjFaninLit0p(p, pObj) );
        // write PO drivers
        Gia_ManForEachPo( p, pObj, i )
            fprintf( pFile, "%u\n", Gia_ObjFaninLit0p(p, pObj) );
    }
    else
    {
        Vec_Int_t * vLits = Gia_AigerCollectLiterals( p );
        Vec_Str_t * vBinary = Gia_AigerWriteLiterals( vLits );
        fwrite( Vec_StrArray(vBinary), 1, Vec_StrSize(vBinary), pFile );
        Vec_StrFree( vBinary );
        Vec_IntFree( vLits );
    }
    Gia_ManInvertConstraints( p );

    // write the nodes into the buffer
    Pos = 0;
    nBufferSize = 8 * Gia_ManAndNum(p) + 100; // skeptically assuming 3 chars per one AIG edge
    pBuffer = ABC_ALLOC( unsigned char, nBufferSize );
    Gia_ManForEachAnd( p, pObj, i )
    {
        uLit  = Abc_Var2Lit( i, 0 );
        uLit0 = Gia_ObjFaninLit0( pObj, i );
        uLit1 = Gia_ObjFaninLit1( pObj, i );
        assert( p->fGiaSimple || Gia_ManBufNum(p) || uLit0 < uLit1 );
        Pos = Gia_AigerWriteUnsignedBuffer( pBuffer, Pos, uLit  - uLit1 );
        Pos = Gia_AigerWriteUnsignedBuffer( pBuffer, Pos, uLit1 - uLit0 );
        if ( Pos > nBufferSize - 10 )
        {
            printf( "Gia_AigerWrite(): AIGER generation has failed because the allocated buffer is too small.\n" );
	        fclose( pFile );
            if ( p != pInit )
                Gia_ManStop( p );
            return;
        }
    }
    assert( Pos < nBufferSize );

    // write the buffer
    fwrite( pBuffer, 1, Pos, pFile );
    ABC_FREE( pBuffer );

    // write the symbol table
    if ( p->vNamesIn && p->vNamesOut )
    {
        assert( Vec_PtrSize(p->vNamesIn)  == Gia_ManCiNum(p) );
        assert( Vec_PtrSize(p->vNamesOut) == Gia_ManCoNum(p) );
        // write PIs
        Gia_ManForEachPi( p, pObj, i )
            fprintf( pFile, "i%d %s\n", i, (char *)Vec_PtrEntry(p->vNamesIn, i) );
        // write latches
        Gia_ManForEachRo( p, pObj, i )
            fprintf( pFile, "l%d %s\n", i, (char *)Vec_PtrEntry(p->vNamesIn, Gia_ManPiNum(p) + i) );
        // write POs
        Gia_ManForEachPo( p, pObj, i )
            fprintf( pFile, "o%d %s\n", i, (char *)Vec_PtrEntry(p->vNamesOut, i) );
    }

    // write the comment
//    fprintf( pFile, "c\n" );
    fprintf( pFile, "c" );

    // write additional AIG
    if ( p->pAigExtra )
    {
        fprintf( pFile, "a" );
        vStrExt = Gia_AigerWriteIntoMemoryStr( p->pAigExtra );
        Gia_FileWriteBufferSize( pFile, Vec_StrSize(vStrExt) );
        fwrite( Vec_StrArray(vStrExt), 1, Vec_StrSize(vStrExt), pFile );
        Vec_StrFree( vStrExt );
        if ( fVerbose ) printf( "Finished writing extension \"a\".\n" );
    }
    // write constraints
    if ( p->nConstrs )
    {
        fprintf( pFile, "c" );
        Gia_FileWriteBufferSize( pFile, 4 );
        Gia_FileWriteBufferSize( pFile, p->nConstrs );
    }
    // write timing information
    if ( p->nAnd2Delay )
    {
        fprintf( pFile, "d" );
        Gia_FileWriteBufferSize( pFile, 4 );
        Gia_FileWriteBufferSize( pFile, p->nAnd2Delay );
    }
    if ( p->pManTime )
    {
        float * pTimes;
        pTimes = Tim_ManGetArrTimes( (Tim_Man_t *)p->pManTime );
        if ( pTimes )
        {
            fprintf( pFile, "i" );
            Gia_FileWriteBufferSize( pFile, 4*Tim_ManPiNum((Tim_Man_t *)p->pManTime) );
            fwrite( pTimes, 1, 4*Tim_ManPiNum((Tim_Man_t *)p->pManTime), pFile );
            ABC_FREE( pTimes );
            if ( fVerbose ) printf( "Finished writing extension \"i\".\n" );
        }
        pTimes = Tim_ManGetReqTimes( (Tim_Man_t *)p->pManTime );
        if ( pTimes )
        {
            fprintf( pFile, "o" );
            Gia_FileWriteBufferSize( pFile, 4*Tim_ManPoNum((Tim_Man_t *)p->pManTime) );
            fwrite( pTimes, 1, 4*Tim_ManPoNum((Tim_Man_t *)p->pManTime), pFile );
            ABC_FREE( pTimes );
            if ( fVerbose ) printf( "Finished writing extension \"o\".\n" );
        }
    }
    // write equivalences
    if ( p->pReprs && p->pNexts )
    {
        extern Vec_Str_t * Gia_WriteEquivClasses( Gia_Man_t * p );
        fprintf( pFile, "e" );
        vStrExt = Gia_WriteEquivClasses( p );
        Gia_FileWriteBufferSize( pFile, Vec_StrSize(vStrExt) );
        fwrite( Vec_StrArray(vStrExt), 1, Vec_StrSize(vStrExt), pFile );
        Vec_StrFree( vStrExt );
    }
    // write flop classes
    if ( p->vFlopClasses )
    {
        fprintf( pFile, "f" );
        Gia_FileWriteBufferSize( pFile, 4*Gia_ManRegNum(p) );
        assert( Vec_IntSize(p->vFlopClasses) == Gia_ManRegNum(p) );
        fwrite( Vec_IntArray(p->vFlopClasses), 1, 4*Gia_ManRegNum(p), pFile );
    }
    // write gate classes
    if ( p->vGateClasses )
    {
        fprintf( pFile, "g" );
        Gia_FileWriteBufferSize( pFile, 4*Gia_ManObjNum(p) );
        assert( Vec_IntSize(p->vGateClasses) == Gia_ManObjNum(p) );
        fwrite( Vec_IntArray(p->vGateClasses), 1, 4*Gia_ManObjNum(p), pFile );
    }
    // write hierarchy info
    if ( p->pManTime )
    {
        fprintf( pFile, "h" );
        vStrExt = Tim_ManSave( (Tim_Man_t *)p->pManTime, 1 );
        Gia_FileWriteBufferSize( pFile, Vec_StrSize(vStrExt) );
        fwrite( Vec_StrArray(vStrExt), 1, Vec_StrSize(vStrExt), pFile );
        Vec_StrFree( vStrExt );
        if ( fVerbose ) printf( "Finished writing extension \"h\".\n" );
    }
    // write packing
    if ( p->vPacking )
    {
        extern Vec_Str_t * Gia_WritePacking( Vec_Int_t * vPacking );
        fprintf( pFile, "k" );
        vStrExt = Gia_WritePacking( p->vPacking );
        Gia_FileWriteBufferSize( pFile, Vec_StrSize(vStrExt) );
        fwrite( Vec_StrArray(vStrExt), 1, Vec_StrSize(vStrExt), pFile );
        Vec_StrFree( vStrExt );
        if ( fVerbose ) printf( "Finished writing extension \"k\".\n" );
    }
    // write edges
    if ( p->vEdge1 )
    {
        Vec_Int_t * vPairs = Gia_ManEdgeToArray( p );
        int i;
        fprintf( pFile, "w" );
        Gia_FileWriteBufferSize( pFile, 4*(Vec_IntSize(vPairs)+1) );
        Gia_FileWriteBufferSize( pFile, Vec_IntSize(vPairs)/2 );
        for ( i = 0; i < Vec_IntSize(vPairs); i++ )
            Gia_FileWriteBufferSize( pFile, Vec_IntEntry(vPairs, i) );
        Vec_IntFree( vPairs );
    }
    // write mapping
    if ( Gia_ManHasMapping(p) )
    {
        extern Vec_Str_t * Gia_AigerWriteMapping( Gia_Man_t * p );
        extern Vec_Str_t * Gia_AigerWriteMappingSimple( Gia_Man_t * p );
        extern Vec_Str_t * Gia_AigerWriteMappingDoc( Gia_Man_t * p );
        fprintf( pFile, "m" );
        vStrExt = Gia_AigerWriteMappingDoc( p );
        Gia_FileWriteBufferSize( pFile, Vec_StrSize(vStrExt) );
        fwrite( Vec_StrArray(vStrExt), 1, Vec_StrSize(vStrExt), pFile );
        Vec_StrFree( vStrExt );
        if ( fVerbose ) printf( "Finished writing extension \"m\".\n" );
    }
    // write placement
    if ( p->pPlacement )
    {
        fprintf( pFile, "p" );
        Gia_FileWriteBufferSize( pFile, 4*Gia_ManObjNum(p) );
        fwrite( p->pPlacement, 1, 4*Gia_ManObjNum(p), pFile );
    }
    // write register classes
    if ( p->vRegClasses )
    {
        int i;
        fprintf( pFile, "r" );
        Gia_FileWriteBufferSize( pFile, 4*(Vec_IntSize(p->vRegClasses)+1) );
        Gia_FileWriteBufferSize( pFile, Vec_IntSize(p->vRegClasses) );
        for ( i = 0; i < Vec_IntSize(p->vRegClasses); i++ )
            Gia_FileWriteBufferSize( pFile, Vec_IntEntry(p->vRegClasses, i) );
    }
    // write register inits
    if ( p->vRegInits )
    {
        int i;
        fprintf( pFile, "s" );
        Gia_FileWriteBufferSize( pFile, 4*(Vec_IntSize(p->vRegInits)+1) );
        Gia_FileWriteBufferSize( pFile, Vec_IntSize(p->vRegInits) );
        for ( i = 0; i < Vec_IntSize(p->vRegInits); i++ )
            Gia_FileWriteBufferSize( pFile, Vec_IntEntry(p->vRegInits, i) );
    }
    // write configuration data
    if ( p->vConfigs )
    {
        fprintf( pFile, "b" );
        assert( p->pCellStr != NULL );
        Gia_FileWriteBufferSize( pFile, 4*Vec_IntSize(p->vConfigs) + strlen(p->pCellStr) + 1 );
        fwrite( p->pCellStr, 1, strlen(p->pCellStr) + 1, pFile );
//        fwrite( Vec_IntArray(p->vConfigs), 1, 4*Vec_IntSize(p->vConfigs), pFile );
        for ( i = 0; i < Vec_IntSize(p->vConfigs); i++ )
            Gia_FileWriteBufferSize( pFile, Vec_IntEntry(p->vConfigs, i) );
    }
    // write choices
    if ( Gia_ManHasChoices(p) )
    {
        int i, nPairs = 0;
        fprintf( pFile, "q" );
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            nPairs += (Gia_ObjSibl(p, i) > 0);
        Gia_FileWriteBufferSize( pFile, 4*(nPairs * 2 + 1) );
        Gia_FileWriteBufferSize( pFile, nPairs );
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            if ( Gia_ObjSibl(p, i) )
            {
                assert( i > Gia_ObjSibl(p, i) );
                Gia_FileWriteBufferSize( pFile, i );
                Gia_FileWriteBufferSize( pFile, Gia_ObjSibl(p, i) );
            }
        if ( fVerbose ) printf( "Finished writing extension \"q\".\n" );
    }
    // write switching activity
    if ( p->pSwitching )
    {
        fprintf( pFile, "u" );
        Gia_FileWriteBufferSize( pFile, Gia_ManObjNum(p) );
        fwrite( p->pSwitching, 1, Gia_ManObjNum(p), pFile );
    }
/*
    // write timing information
    if ( p->pManTime )
    {
        fprintf( pFile, "t" );
        vStrExt = Tim_ManSave( (Tim_Man_t *)p->pManTime, 0 );
        Gia_FileWriteBufferSize( pFile, Vec_StrSize(vStrExt) );
        fwrite( Vec_StrArray(vStrExt), 1, Vec_StrSize(vStrExt), pFile );
        Vec_StrFree( vStrExt );
    }
*/
    // write object classes
    if ( p->vObjClasses )
    {
        fprintf( pFile, "v" );
        Gia_FileWriteBufferSize( pFile, 4*Gia_ManObjNum(p) );
        assert( Vec_IntSize(p->vObjClasses) == Gia_ManObjNum(p) );
        fwrite( Vec_IntArray(p->vObjClasses), 1, 4*Gia_ManObjNum(p), pFile );
    }
    // write name
    if ( p->pName )
    {
        fprintf( pFile, "n" );
        Gia_FileWriteBufferSize( pFile, strlen(p->pName)+1 );
        fwrite( p->pName, 1, strlen(p->pName), pFile );
        fprintf( pFile, "%c", '\0' );
    }
    // write comments
    fprintf( pFile, "\nThis file was produced by the GIA package in ABC on %s\n", Gia_TimeStamp() );
    fprintf( pFile, "For information about AIGER format, refer to %s\n", "http://fmv.jku.at/aiger" );
	fclose( pFile );
    if ( p != pInit )
    {
        pInit->pManTime  = p->pManTime;  p->pManTime = NULL;
        pInit->vNamesIn  = p->vNamesIn;  p->vNamesIn = NULL;
        pInit->vNamesOut = p->vNamesOut; p->vNamesOut = NULL;
        Gia_ManStop( p );
    }
}